

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

void __thiscall
flecs::_::column_args<Position,Rocket>::populate_columns<Position*,Rocket*>
          (column_args<Position,Rocket> *this,ecs_iter_t *iter,size_t index,Position *comp,
          Rocket *comps)

{
  _Bool _Var1;
  void *pvVar2;
  int32_t column;
  
  column = (int32_t)(index + 1);
  pvVar2 = ecs_column_w_size(iter,8,column);
  *(void **)(this + index * 0x10) = pvVar2;
  _Var1 = ecs_is_owned(iter,column);
  this[index * 0x10 + 8] = (column_args<Position,Rocket>)(~_Var1 & pvVar2 != (void *)0x0);
  populate_columns<Rocket*>(this,iter,index + 1,comps);
  return;
}

Assistant:

void populate_columns(ecs_iter_t *iter, size_t index, T comp, Targs... comps) {
        int32_t column = static_cast<int32_t>(index + 1);
        void *ptr = ecs_column_w_size(iter, sizeof(*comp), column);
        m_columns[index].ptr = ptr;
        m_columns[index].is_shared = !ecs_is_owned(iter, column) && ptr != nullptr;
        populate_columns(iter, index + 1, comps ...);
    }